

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::post_peer_info(torrent *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> v;
  undefined1 auStack_48 [24];
  element_type *peStack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  auStack_48._16_8_ =
       (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
        )0x0;
  peStack_30 = (element_type *)0x0;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  get_peer_info(this,(vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
                      *)(auStack_48 + 0x10));
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)auStack_48);
  alert_manager::
  emplace_alert<libtorrent::peer_info_alert,libtorrent::torrent_handle,std::vector<libtorrent::v1_2::peer_info,std::allocator<libtorrent::v1_2::peer_info>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar2),(torrent_handle *)auStack_48,
             (vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *)
             (auStack_48 + 0x10));
  if ((piece_picker *)auStack_48._8_8_ != (piece_picker *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(auStack_48._8_8_ + 0xc);
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = *(_Atomic_word *)(auStack_48._8_8_ + 0xc);
      *(int *)(auStack_48._8_8_ + 0xc) = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(*(_func_int ***)auStack_48._8_8_)[3])();
    }
  }
  ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::~vector
            ((vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *)
             (auStack_48 + 0x10));
  return;
}

Assistant:

void torrent::post_peer_info()
	{
		std::vector<peer_info> v;
		get_peer_info(&v);
		alerts().emplace_alert<peer_info_alert>(get_handle(), std::move(v));
	}